

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O2

void sysbvm_bytecodeJit_jit(sysbvm_context_t *context,sysbvm_functionBytecode_t *functionBytecode)

{
  byte bVar1;
  sysbvm_context_t *context_00;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  uint8_t *value;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  char *message;
  byte opcode;
  ulong uVar11;
  sysbvm_tuple_t sVar12;
  long lVar13;
  int16_t decodedOperands [64];
  uint8_t *codeWriteablePointer;
  ulong local_4a8;
  uint8_t *codeExecutablePointer;
  sysbvm_context_t *local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  long local_478;
  sysbvm_gdb_jit_code_entry_t *entry;
  sysbvm_bytecodeJit_t jit;
  
  uVar11 = 0;
  sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
  sysbvm_bytecodeJit_initialize(&jit,context);
  jit.sourcePosition = functionBytecode->sourcePosition;
  jit.compiledProgramEntity = functionBytecode->definition;
  jit.literalVectorGCRoot = sysbvm_heap_allocateGCRootTableEntry(&context->heap);
  uVar7 = functionBytecode->literalVector;
  *jit.literalVectorGCRoot = uVar7;
  local_480 = functionBytecode->instructions;
  if ((local_480 & 0xf) == 0 && local_480 != 0) {
    uVar11 = (ulong)*(uint *)(local_480 + 0xc);
  }
  decodedOperands[0x38] = 0;
  decodedOperands[0x39] = 0;
  decodedOperands[0x3a] = 0;
  decodedOperands[0x3b] = 0;
  decodedOperands[0x3c] = 0;
  decodedOperands[0x3d] = 0;
  decodedOperands[0x3e] = 0;
  decodedOperands[0x3f] = 0;
  decodedOperands[0x30] = 0;
  decodedOperands[0x31] = 0;
  decodedOperands[0x32] = 0;
  decodedOperands[0x33] = 0;
  decodedOperands[0x34] = 0;
  decodedOperands[0x35] = 0;
  decodedOperands[0x36] = 0;
  decodedOperands[0x37] = 0;
  decodedOperands[0x28] = 0;
  decodedOperands[0x29] = 0;
  decodedOperands[0x2a] = 0;
  decodedOperands[0x2b] = 0;
  decodedOperands[0x2c] = 0;
  decodedOperands[0x2d] = 0;
  decodedOperands[0x2e] = 0;
  decodedOperands[0x2f] = 0;
  decodedOperands[0x20] = 0;
  decodedOperands[0x21] = 0;
  decodedOperands[0x22] = 0;
  decodedOperands[0x23] = 0;
  decodedOperands[0x24] = 0;
  decodedOperands[0x25] = 0;
  decodedOperands[0x26] = 0;
  decodedOperands[0x27] = 0;
  decodedOperands[0x18] = 0;
  decodedOperands[0x19] = 0;
  decodedOperands[0x1a] = 0;
  decodedOperands[0x1b] = 0;
  decodedOperands[0x1c] = 0;
  decodedOperands[0x1d] = 0;
  decodedOperands[0x1e] = 0;
  decodedOperands[0x1f] = 0;
  decodedOperands[0x10] = 0;
  decodedOperands[0x11] = 0;
  decodedOperands[0x12] = 0;
  decodedOperands[0x13] = 0;
  decodedOperands[0x14] = 0;
  decodedOperands[0x15] = 0;
  decodedOperands[0x16] = 0;
  decodedOperands[0x17] = 0;
  decodedOperands[8] = 0;
  decodedOperands[9] = 0;
  decodedOperands[10] = 0;
  decodedOperands[0xb] = 0;
  decodedOperands[0xc] = 0;
  decodedOperands[0xd] = 0;
  decodedOperands[0xe] = 0;
  decodedOperands[0xf] = 0;
  decodedOperands[0] = 0;
  decodedOperands[1] = 0;
  decodedOperands[2] = 0;
  decodedOperands[3] = 0;
  decodedOperands[4] = 0;
  decodedOperands[5] = 0;
  decodedOperands[6] = 0;
  decodedOperands[7] = 0;
  uVar9 = functionBytecode->argumentCount;
  if (uVar9 == 0 || (uVar9 & 0xf) != 0) {
    jit.argumentCount = (long)uVar9 >> 4;
  }
  else {
    jit.argumentCount = *(size_t *)(uVar9 + 0x10);
  }
  uVar9 = functionBytecode->captureVectorSize;
  if (uVar9 == 0 || (uVar9 & 0xf) != 0) {
    jit.captureVectorSize = (long)uVar9 >> 4;
  }
  else {
    jit.captureVectorSize = *(size_t *)(uVar9 + 0x10);
  }
  if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
    jit.literalCount = (size_t)(*(uint *)(uVar7 + 0xc) >> 3);
  }
  else {
    jit.literalCount = 0;
  }
  uVar7 = functionBytecode->localVectorSize;
  if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
    jit.localVectorSize = (long)uVar7 >> 4;
  }
  else {
    jit.localVectorSize = *(size_t *)(uVar7 + 0x10);
  }
  local_498 = context;
  jit.pcDestinations = (intptr_t *)malloc(uVar11 * 8);
  memset(jit.pcDestinations,0xff,uVar11 * 8);
  sysbvm_jit_prologue(&jit);
  local_478 = local_480 + 0x11;
  uVar9 = 0;
  uVar7 = 0;
  local_490 = uVar11;
  do {
    while( true ) {
      if (uVar11 <= uVar7) {
        sysbvm_jit_finish(&jit);
        uVar11 = jit.objectFileHeader.size + 0xf & 0xfffffffffffffff0;
        uVar9 = jit.instructions.size + 0xf & 0xfffffffffffffff0;
        uVar7 = jit.constants.size + 0xf & 0xfffffffffffffff0;
        sVar10 = (jit.unwindInfo.size + 0xf & 0xfffffffffffffff0) + uVar7 + uVar9 + uVar11 +
                 (jit.dwarfDebugInfoBuilder.str.size + 0xf & 0xfffffffffffffff0) +
                 (jit.dwarfDebugInfoBuilder.line.size + 0xf & 0xfffffffffffffff0) +
                 (jit.dwarfEhBuilder.buffer.size + 0xf & 0xfffffffffffffff0) +
                 (jit.objectFileContent.size + 0xf & 0xfffffffffffffff0) +
                 (jit.dwarfDebugInfoBuilder.info.size + 0xf & 0xfffffffffffffff0) +
                 (jit.dwarfDebugInfoBuilder.abbrev.size + 0xf & 0xfffffffffffffff0);
        codeWriteablePointer = (uint8_t *)0x0;
        codeExecutablePointer = (uint8_t *)0x0;
        sysbvm_chunkedAllocator_allocateWithDualMapping
                  (&(local_498->heap).codeAllocator,sVar10,0x10,&codeWriteablePointer,
                   &codeExecutablePointer);
        _Var4 = sysbvm_virtualMemory_lockCodePagesForWriting
                          (codeWriteablePointer,codeExecutablePointer,sVar10);
        if (_Var4) {
          memset(codeWriteablePointer + uVar11,0xcc,uVar9);
          memset(codeWriteablePointer + uVar9 + uVar11,0,uVar7);
          value = sysbvm_jit_installIn(&jit,codeWriteablePointer,codeExecutablePointer);
          sysbvm_virtualMemory_unlockCodePagesForExecution
                    (codeWriteablePointer,codeExecutablePointer,sVar10);
          context_00 = local_498;
          if ((jit.objectFileHeader.size != 0) && (jit.objectFileContent.size != 0)) {
            entry = (sysbvm_gdb_jit_code_entry_t *)calloc(1,0x20);
            sysbvm_dynarray_add(&context_00->jittedObjectFileEntries,&entry);
            sysbvm_gdb_registerObjectFile(entry,codeExecutablePointer,sVar10);
          }
          if ((ulong)(value + 0x800000000000000) >> 0x3c == 0) {
            sVar12 = (long)value << 4 | 0xc;
          }
          else {
            sVar12 = sysbvm_tuple_int64_encodeBig(context_00,(int64_t)value);
          }
          functionBytecode->jittedCode = sVar12;
          functionBytecode->jittedCodeSessionToken = (context_00->roots).sessionToken;
          sysbvm_jit_patchTrampolineWithRealEntryPoint(&jit,functionBytecode);
          sysbvm_bytecodeJit_jitFree(&jit);
          return;
        }
        abort();
      }
      jit.pcDestinations[uVar7] = jit.instructions.size;
      sysbvm_jit_storePC(&jit,(uint16_t)uVar7);
      sysbvm_bytecodeJit_addSourcePositionRecord
                (&jit,functionBytecode,(uint16_t)uVar7,jit.instructions.size);
      bVar1 = *(byte *)(local_480 + 0x10 + uVar7);
      if (bVar1 != 0x1f) break;
      uVar9 = (ulong)*(byte *)(local_480 + 0x12 + uVar7) << 8 | uVar9 << 0x10 |
              (ulong)*(byte *)(local_480 + 0x11 + uVar7);
      uVar7 = uVar7 + 3;
    }
    if (bVar1 < 0x40) {
      uVar9 = (ulong)(bVar1 >> 4);
      local_4a8 = 0;
      opcode = bVar1;
    }
    else {
      uVar9 = (ulong)(bVar1 & 0xf) | uVar9 << 4;
      opcode = bVar1 & 0xf0;
      local_4a8 = 0;
      if (opcode == 0xe0) {
        local_4a8 = uVar9;
      }
      uVar9 = (ulong)sysbvm_implicitVariableBytecodeOperandCountTable[bVar1 >> 4] +
              (uVar9 << (opcode == 0xe0));
      if (0x3f < uVar9) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:487: assertion failure: operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                  );
      }
    }
    sVar10 = uVar7 + 1;
    if (uVar11 < sVar10 + uVar9 * 2) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:488: assertion failure: pc + operandCount*2 <= instructionsSize"
                );
    }
    lVar13 = uVar7 + local_478;
    for (uVar7 = 0; (uVar7 & 0xff) < uVar9; uVar7 = uVar7 + 1) {
      sVar10 = sVar10 + 2;
      decodedOperands[uVar7 & 0xff] = *(int16_t *)(lVar13 + uVar7 * 2);
    }
    bVar2 = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(opcode);
    local_488 = (ulong)opcode;
    bVar3 = sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(opcode);
    for (uVar7 = 0; bVar2 != uVar7; uVar7 = uVar7 + 1) {
      uVar5 = decodedOperands[uVar7];
      if ((~uVar5 & 3) != 0) {
        sysbvm_error("Bytecode destination operands must be in the local vector.");
        uVar5 = decodedOperands[uVar7];
      }
      if ((-1 < (short)((uint)(int)(short)uVar5 >> 2)) &&
         (jit.localVectorSize <= ((uint)(int)(short)uVar5 >> 2 & 0xffff))) {
        sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
      }
    }
    lVar13 = bVar3 + local_4a8;
    for (; uVar11 = local_490, (ulong)bVar2 < uVar9 - lVar13; bVar2 = bVar2 + 1) {
      if (0x3f < bVar2) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:513: assertion failure: i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                  );
      }
      switch(decodedOperands[bVar2] & 3) {
      case 0:
        message = "Bytecode operand is beyond the argument vector bounds.";
        uVar7 = jit.argumentCount;
        break;
      case 1:
        message = "Bytecode operand is beyond the capture vector bounds.";
        uVar7 = jit.captureVectorSize;
        break;
      case 2:
        message = "Bytecode operand is beyond the literal vector bounds.";
        uVar7 = jit.literalCount;
        break;
      case 3:
        message = "Bytecode operand is beyond the local vector bounds.";
        uVar7 = jit.localVectorSize;
      }
      if (uVar7 <= (ulong)(long)(short)((uint)(int)decodedOperands[bVar2] >> 2)) {
        sysbvm_error(message);
      }
    }
    if (opcode < 0x3c) {
      (*(code *)(&DAT_00168488 + *(int *)(&DAT_00168488 + local_488 * 4)))();
      return;
    }
    iVar6 = (int)local_488;
    uVar8 = (uint)bVar1;
    if (iVar6 == 0x40) {
      iVar6 = 0;
LAB_0014ae74:
      sysbvm_jit_functionApply
                (&jit,decodedOperands[0],decodedOperands[1],(ulong)(uVar8 & 0xf),decodedOperands + 2
                 ,iVar6);
    }
    else {
      if (iVar6 == 0x50) {
        iVar6 = 1;
        goto LAB_0014ae74;
      }
      if (iVar6 == 0x60) {
        sysbvm_jit_send(&jit,decodedOperands[0],decodedOperands[1],(ulong)(uVar8 & 0xf),
                        decodedOperands + 2,0);
      }
      else if (iVar6 == 0x70) {
        sysbvm_jit_sendWithReceiverType
                  (&jit,decodedOperands[0],decodedOperands[1],decodedOperands[2],
                   (ulong)(uVar8 & 0xf),decodedOperands + 3,0);
      }
      else if (iVar6 == 0x80) {
        sysbvm_jit_makeArray(&jit,decodedOperands[0],(ulong)(uVar8 & 0xf),decodedOperands + 1);
      }
      else if (iVar6 == 0x90) {
        sysbvm_jit_makeByteArray(&jit,decodedOperands[0],(ulong)(uVar8 & 0xf),decodedOperands + 1);
      }
      else if (iVar6 == 0xa0) {
        sysbvm_jit_makeClosureWithCaptures
                  (&jit,decodedOperands[0],decodedOperands[1],(ulong)(uVar8 & 0xf),
                   decodedOperands + 2);
      }
      else if (iVar6 == 0xb0) {
        sysbvm_jit_makeDictionary(&jit,decodedOperands[0],(ulong)(uVar8 & 0xf),decodedOperands + 1);
      }
      else if (iVar6 == 0xe0) {
        sysbvm_jit_caseJump(&jit,decodedOperands[0],local_4a8,decodedOperands + 1,
                            decodedOperands + 1 + local_4a8,decodedOperands[uVar9 - 1],sVar10);
      }
      else {
        sysbvm_error("Unsupported bytecode instruction.");
      }
    }
    uVar9 = 0;
    uVar7 = sVar10;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_jit(sysbvm_context_t *context, sysbvm_functionBytecode_t *functionBytecode)
{
    (void)context;
    sysbvm_bytecodeInterpreter_ensureTablesAreFilled();

    sysbvm_bytecodeJit_t jit;
    sysbvm_bytecodeJit_initialize(&jit, context);

    jit.sourcePosition = functionBytecode->sourcePosition;
    jit.compiledProgramEntity = functionBytecode->definition;

    jit.literalVectorGCRoot = sysbvm_heap_allocateGCRootTableEntry(&context->heap);
    *jit.literalVectorGCRoot = functionBytecode->literalVector;

    size_t instructionsSize = sysbvm_tuple_getSizeInBytes(functionBytecode->instructions);
    uint8_t *instructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(functionBytecode->instructions)->bytes;

    int16_t decodedOperands[SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE] = {0};
    jit.argumentCount = sysbvm_tuple_size_decode(functionBytecode->argumentCount);
    jit.captureVectorSize = sysbvm_tuple_size_decode(functionBytecode->captureVectorSize);
    jit.literalCount = sysbvm_tuple_getSizeInSlots(functionBytecode->literalVector);
    jit.localVectorSize = sysbvm_tuple_size_decode(functionBytecode->localVectorSize);

    jit.pcDestinations = (intptr_t*)malloc(sizeof(intptr_t)*instructionsSize);
    memset(jit.pcDestinations, -1, sizeof(intptr_t)*instructionsSize);

    sysbvm_jit_prologue(&jit);

    size_t pc = 0;
    size_t countExtension = 0;
    while(pc < instructionsSize)
    {
        jit.pcDestinations[pc] = jit.instructions.size;
        sysbvm_jit_storePC(&jit, (uint16_t)pc);

        sysbvm_bytecodeJit_addSourcePositionRecord(&jit, functionBytecode, (uint16_t)pc, jit.instructions.size);

        uint8_t opcode = instructions[pc++];
        if(opcode == SYSBVM_OPCODE_COUNT_EXTENSION)
        {
            uint8_t lowByte = instructions[pc++];
            uint8_t highByte = instructions[pc++];
            countExtension = (countExtension << 16) | (highByte << 8) | lowByte;
            continue;
        }

        uint8_t standardOpcode = opcode;
        size_t operandCount = 0;
        size_t caseCount = 0;
        if(opcode >= SYSBVM_OPCODE_FIRST_VARIABLE)
        {
            operandCount = (countExtension << 4) + (opcode & 0x0F);
            standardOpcode = opcode & 0xF0;
            if(standardOpcode == SYSBVM_OPCODE_CASE_JUMP)
            {
                caseCount = operandCount;
                operandCount *= 2;
            }

            operandCount += sysbvm_implicitVariableBytecodeOperandCountTable[opcode >> 4];
        }
        else
        {
            operandCount = opcode >> 4;
        }
        countExtension = 0;

        // Decode the operands.
        SYSBVM_ASSERT(operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);
        SYSBVM_ASSERT(pc + operandCount*2 <= instructionsSize);
        for(uint8_t i = 0; i < operandCount; ++i)
        {
            uint16_t lowByte = instructions[pc++];
            uint16_t highByte = instructions[pc++];
            decodedOperands[i] = lowByte | (highByte << 8);
        }

        // Validate the destination operands.
        uint8_t destinationOperandCount = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(standardOpcode);
        size_t offsetOperandCount = caseCount + sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(standardOpcode);

        for(uint8_t i = 0; i < destinationOperandCount; ++i)
        {
            if((decodedOperands[i] & SYSBVM_OPERAND_VECTOR_BITMASK) != SYSBVM_OPERAND_VECTOR_LOCAL)
                sysbvm_error("Bytecode destination operands must be in the local vector.");
            
            int16_t vectorIndex = decodedOperands[i] >> SYSBVM_OPERAND_VECTOR_BITS;
            if(vectorIndex >= 0 && (size_t)vectorIndex >= jit.localVectorSize)
                sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
        }

        // Fetch the source operands.
        for(uint8_t i = destinationOperandCount; i < operandCount - offsetOperandCount; ++i)
        {
            SYSBVM_ASSERT(i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);

            int16_t decodedOperand = decodedOperands[i];
            int16_t vectorIndex = decodedOperand >> SYSBVM_OPERAND_VECTOR_BITS;
            uint8_t vectorType = decodedOperand & SYSBVM_OPERAND_VECTOR_BITMASK;
            switch(vectorType)
            {
            case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
                if((size_t)vectorIndex >= jit.argumentCount)
                    sysbvm_error("Bytecode operand is beyond the argument vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_CAPTURES:
                if((size_t)vectorIndex >= jit.captureVectorSize)
                    sysbvm_error("Bytecode operand is beyond the capture vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LITERAL:
                if((size_t)vectorIndex >= jit.literalCount)
                    sysbvm_error("Bytecode operand is beyond the literal vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LOCAL:
                if((size_t)vectorIndex >= jit.localVectorSize)
                    sysbvm_error("Bytecode operand is beyond the local vector bounds.");
                break;
            default:
                abort();
            }
        }

        // Execute the opcodes.
        switch(standardOpcode)
        {
        // Zero operands
        case SYSBVM_OPCODE_NOP:
            // Nothing is required here.
            break;
        case SYSBVM_OPCODE_BREAKPOINT:
            // Nothing is required here.
            sysbvm_jit_breakpoint(&jit);
            break;
        case SYSBVM_OPCODE_UNREACHABLE:
            // Nothing is required here.
            sysbvm_jit_unreachable(&jit);
            break;
        
        // One operands
        case SYSBVM_OPCODE_RETURN:
            sysbvm_jit_return(&jit, decodedOperands[0]);
            break;
        case SYSBVM_OPCODE_JUMP:
            if(decodedOperands[0] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelative(&jit, pc + decodedOperands[0]);
            break;
        // Two operands.
        case SYSBVM_OPCODE_ALLOCA:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_withEmptyBox, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_load, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_bytecodeJit_symbolValueBinding_getValue, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_STORE:
            sysbvm_jit_callWithContextNoResult2(&jit, &sysbvm_pointerLikeType_store, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_MOVE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_TRUE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfTrue(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_FALSE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfFalse(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_SET_DEBUG_VALUE:
            // NOP
            break;

        // Three operands.
        case SYSBVM_OPCODE_ALLOCA_WITH_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_pointerLikeType_withBoxForValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_COERCE_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_coerceValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_DOWNCAST_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_downCastValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_MAKE_ASSOCIATION:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_association_create, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_slotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_refSlotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;

        // Variable operand.
        case SYSBVM_OPCODE_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_UNCHECKED_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK);
            break;
        case SYSBVM_OPCODE_SEND:
            sysbvm_jit_send(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_SEND_WITH_LOOKUP:
            sysbvm_jit_sendWithReceiverType(&jit, decodedOperands[0], decodedOperands[1], decodedOperands[2], opcode & 0xF, decodedOperands + 3, 0);
            break;
        case SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeByteArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES:
            sysbvm_jit_makeClosureWithCaptures(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2);
            break;
        case SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS:
            sysbvm_jit_makeDictionary(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;

        case SYSBVM_OPCODE_CASE_JUMP:
            sysbvm_jit_caseJump(&jit, decodedOperands[0], caseCount, decodedOperands + 1, decodedOperands + 1 + caseCount, decodedOperands[operandCount - 1], pc);
            break;
        default:
            sysbvm_error("Unsupported bytecode instruction.");
            break;
        }
    }

    sysbvm_jit_finish(&jit);

    size_t objectFileHeaderSize = sysbvm_sizeAlignedTo(jit.objectFileHeader.size, 16);
    size_t textSectionSize = sysbvm_sizeAlignedTo(jit.instructions.size, 16);
    size_t rodataSectionSize = sysbvm_sizeAlignedTo(jit.constants.size, 16);
    size_t unwindInfoSize = sysbvm_sizeAlignedTo(jit.unwindInfo.size, 16)  + sysbvm_sizeAlignedTo(jit.dwarfEhBuilder.buffer.size, 16);
    size_t debugInfoSize = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.line.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.str.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.abbrev.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.info.size, 16);
    size_t objectFileContentSize = sysbvm_sizeAlignedTo(jit.objectFileContent.size, 16);

    size_t requiredCodeSize = objectFileHeaderSize + textSectionSize + rodataSectionSize + unwindInfoSize + debugInfoSize + objectFileContentSize;
    uint8_t *codeWriteablePointer = NULL;
    uint8_t *codeExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&context->heap.codeAllocator, requiredCodeSize, 16, (void**)&codeWriteablePointer, (void**)&codeExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(codeWriteablePointer, codeExecutablePointer, requiredCodeSize))
        abort();

    memset(codeWriteablePointer + objectFileHeaderSize, 0xcc, textSectionSize); // int3;
    memset(codeWriteablePointer + objectFileHeaderSize + textSectionSize, 0, rodataSectionSize); // int3;
    uint8_t *entryPointPointer = sysbvm_jit_installIn(&jit, codeWriteablePointer, codeExecutablePointer);
    sysbvm_virtualMemory_unlockCodePagesForExecution(codeWriteablePointer, codeExecutablePointer, requiredCodeSize);

    // Register the object file with gdb.
    if(jit.objectFileHeader.size > 0 && jit.objectFileContent.size > 0)
    {
        sysbvm_gdb_jit_code_entry_t *entry = (sysbvm_gdb_jit_code_entry_t*)calloc(1, sizeof(sysbvm_gdb_jit_code_entry_t));
        sysbvm_dynarray_add(&context->jittedObjectFileEntries, &entry);
        sysbvm_gdb_registerObjectFile(entry, codeExecutablePointer, requiredCodeSize);
    }

    functionBytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, (sysbvm_systemHandle_t)(uintptr_t)entryPointPointer);
    functionBytecode->jittedCodeSessionToken = context->roots.sessionToken;

    // Patch the trampoline.
    sysbvm_jit_patchTrampolineWithRealEntryPoint(&jit, functionBytecode);

    sysbvm_bytecodeJit_jitFree(&jit);
}